

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Aig_Man_t * Aig_ManChoiceConstructive(Vec_Ptr_t *vAigs,int fVerbose)

{
  Aig_Man_t *pAVar1;
  Aig_Man_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Man_t *pThis;
  Vec_Ptr_t *vPios;
  void *pvVar4;
  Tim_Man_t *pTVar5;
  int i;
  long lVar6;
  ulong uVar7;
  
  pAVar1 = (Aig_Man_t *)Vec_PtrEntry(vAigs,0);
  pAVar2 = Aig_ManDupOrdered(pAVar1);
  if (pAVar2->pReprs == (Aig_Obj_t **)0x0) {
    uVar7 = (ulong)vAigs->nSize;
    lVar6 = (long)pAVar2->vObjs->nSize * uVar7;
    pAVar2->nReprsAlloc = (int)lVar6;
    ppAVar3 = (Aig_Obj_t **)calloc(1,lVar6 * 8);
    pAVar2->pReprs = ppAVar3;
    for (i = 1; i < (int)uVar7; i = i + 1) {
      pThis = (Aig_Man_t *)Vec_PtrEntry(vAigs,i);
      Aig_ManChoiceConstructiveOne(pAVar2,pAVar1,pThis);
      uVar7 = (ulong)(uint)vAigs->nSize;
      pAVar1 = pThis;
    }
    pAVar1 = Aig_ManRehash(pAVar2);
    Aig_ManMarkValidChoices(pAVar1);
    pAVar2 = (Aig_Man_t *)Vec_PtrEntry(vAigs,0);
    vPios = Aig_ManOrderPios(pAVar1,pAVar2);
    pAVar2 = Aig_ManDupDfsGuided(pAVar1,vPios);
    Aig_ManStop(pAVar1);
    Vec_PtrFree(vPios);
    pvVar4 = Vec_PtrEntry(vAigs,0);
    if (*(Tim_Man_t **)((long)pvVar4 + 0x160) != (Tim_Man_t *)0x0) {
      pTVar5 = Tim_ManDup(*(Tim_Man_t **)((long)pvVar4 + 0x160),0);
      pAVar2->pManTime = pTVar5;
    }
    Aig_ManChoiceLevel(pAVar2);
    return pAVar2;
  }
  __assert_fail("pNew->pReprs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                ,0x625,"Aig_Man_t *Aig_ManChoiceConstructive(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Aig_ManChoiceConstructive( Vec_Ptr_t * vAigs, int fVerbose )
{
    Vec_Ptr_t * vPios;
    Aig_Man_t * pNew, * pThis, * pPrev, * pTemp;
    int i;
    // start AIG with choices
    pPrev = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    pNew = Aig_ManDupOrdered( pPrev );
    // create room for equivalent nodes and representatives
    assert( pNew->pReprs == NULL );
    pNew->nReprsAlloc = Vec_PtrSize(vAigs) * Aig_ManObjNumMax(pNew);
    pNew->pReprs = ABC_ALLOC( Aig_Obj_t *, pNew->nReprsAlloc );
    memset( pNew->pReprs, 0, sizeof(Aig_Obj_t *) * pNew->nReprsAlloc );
    // add other AIGs one by one
    Vec_PtrForEachEntryStart( Aig_Man_t *, vAigs, pThis, i, 1 )
    {
        Aig_ManChoiceConstructiveOne( pNew, pPrev, pThis );
        pPrev = pThis;
    }
    // derive the result of choicing
    pNew = Aig_ManRehash( pNew );
    // create the equivalent nodes lists
    Aig_ManMarkValidChoices( pNew );
    // reconstruct the network
    vPios = Aig_ManOrderPios( pNew, (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 ) );
    pNew = Aig_ManDupDfsGuided( pTemp = pNew, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );
    // duplicate the timing manager
    pTemp = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    if ( pTemp->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)pTemp->pManTime, 0 );
    // reset levels
    Aig_ManChoiceLevel( pNew );
    return pNew;
}